

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

PFN_vkVoidFunction shim_vkGetDeviceProcAddr(VkDevice device,char *pName)

{
  int iVar1;
  char *pName_local;
  VkDevice device_local;
  
  if (device == (VkDevice)0x0) {
    device_local = (VkDevice)0x0;
  }
  else {
    iVar1 = strcmp(pName,"vkDestroyDevice");
    if (iVar1 == 0) {
      device_local = (VkDevice)shim_vkDestroyDevice;
    }
    else {
      iVar1 = strcmp(pName,"vkGetDeviceQueue");
      if (iVar1 == 0) {
        device_local = (VkDevice)shim_vkGetDeviceQueue;
      }
      else {
        iVar1 = strcmp(pName,"vkCreateCommandPool");
        if (iVar1 == 0) {
          device_local = (VkDevice)shim_vkCreateCommandPool;
        }
        else {
          iVar1 = strcmp(pName,"vkCreateFence");
          if (iVar1 == 0) {
            device_local = (VkDevice)shim_vkCreateFence;
          }
          else {
            iVar1 = strcmp(pName,"vkDestroyFence");
            if (iVar1 == 0) {
              device_local = (VkDevice)shim_vkDestroyFence;
            }
            else {
              iVar1 = strcmp(pName,"vkCreateSwapchainKHR");
              if (iVar1 == 0) {
                device_local = (VkDevice)shim_vkCreateSwapchainKHR;
              }
              else {
                iVar1 = strcmp(pName,"vkGetSwapchainImagesKHR");
                if (iVar1 == 0) {
                  device_local = (VkDevice)shim_vkGetSwapchainImagesKHR;
                }
                else {
                  iVar1 = strcmp(pName,"vkCreateImageView");
                  if (iVar1 == 0) {
                    device_local = (VkDevice)shim_vkCreateImageView;
                  }
                  else {
                    iVar1 = strcmp(pName,"vkDestroyImageView");
                    if (iVar1 == 0) {
                      device_local = (VkDevice)shim_vkDestroyImageView;
                    }
                    else {
                      iVar1 = strcmp(pName,"vkDestroySwapchainKHR");
                      if (iVar1 == 0) {
                        device_local = (VkDevice)shim_vkDestroySwapchainKHR;
                      }
                      else {
                        iVar1 = strcmp(pName,"vkAcquireNextImageKHR");
                        if (iVar1 == 0) {
                          device_local = (VkDevice)shim_vkAcquireNextImageKHR;
                        }
                        else {
                          device_local = (VkDevice)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (PFN_vkVoidFunction)device_local;
}

Assistant:

VKAPI_ATTR PFN_vkVoidFunction VKAPI_CALL shim_vkGetDeviceProcAddr(VkDevice device, const char* pName) {
    if (device == VK_NULL_HANDLE) {
        return nullptr;
    }
    GPA_IMPL(vkDestroyDevice)
    GPA_IMPL(vkGetDeviceQueue)
    GPA_IMPL(vkCreateCommandPool)
    GPA_IMPL(vkCreateFence)
    GPA_IMPL(vkDestroyFence)
    GPA_IMPL(vkCreateSwapchainKHR)
    GPA_IMPL(vkGetSwapchainImagesKHR)
    GPA_IMPL(vkCreateImageView)
    GPA_IMPL(vkDestroyImageView)
    GPA_IMPL(vkDestroySwapchainKHR)
    GPA_IMPL(vkAcquireNextImageKHR)

    return nullptr;
}